

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

char * ma_find_char(char *str,char c,int *index)

{
  int local_2c;
  int i;
  int *index_local;
  char c_local;
  char *str_local;
  
  local_2c = 0;
  while( true ) {
    if (str[local_2c] == '\0') {
      if (index != (int *)0x0) {
        *index = -1;
      }
      return (char *)0x0;
    }
    if (str[local_2c] == c) break;
    local_2c = local_2c + 1;
  }
  if (index != (int *)0x0) {
    *index = local_2c;
  }
  return str + local_2c;
}

Assistant:

static const char* ma_find_char(const char* str, char c, int* index)
{
    int i = 0;
    for (;;) {
        if (str[i] == '\0') {
            if (index) *index = -1;
            return NULL;
        }

        if (str[i] == c) {
            if (index) *index = i;
            return str + i;
        }

        i += 1;
    }

    /* Should never get here, but treat it as though the character was not found to make me feel better inside. */
    if (index) *index = -1;
    return NULL;
}